

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
ptc::Print<char>::
print_backend<std::__cxx11::ostringstream&,char_const(&)[8],char_const(&)[12],char_const(&)[15]>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,
          char (*first) [8],char (*args) [12],char (*args_1) [15])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  ANSI local_3c [3];
  
  std::mutex::lock((mutex *)mutex_);
  local_3c[0] = first;
  bVar3 = is_escape<char[8]>(first,local_3c);
  if ((bVar3) || ((this->pattern)._M_string_length == 0)) {
    std::operator<<((ostream *)os,*first);
  }
  else {
    poVar4 = std::operator<<((ostream *)os,(string *)&this->pattern);
    poVar4 = std::operator<<(poVar4,*first);
    std::operator<<(poVar4,(string *)&this->pattern);
  }
  local_3c[0] = first;
  bVar3 = is_escape<char[8]>(first,local_3c);
  psVar5 = (string *)&this->pattern;
  sVar2 = (this->pattern)._M_string_length;
  if (bVar3) {
    if (sVar2 == 0) {
      poVar4 = std::operator<<((ostream *)os,*args);
      psVar5 = (string *)&this->sep;
      std::operator<<(poVar4,psVar5);
      poVar4 = std::operator<<((ostream *)os,*args_1);
    }
    else {
      poVar4 = std::operator<<((ostream *)os,psVar5);
      poVar4 = std::operator<<(poVar4,*args);
      poVar4 = std::operator<<(poVar4,psVar5);
      std::operator<<(poVar4,(string *)&this->sep);
      poVar4 = std::operator<<((ostream *)os,psVar5);
      poVar4 = std::operator<<(poVar4,*args_1);
      poVar4 = std::operator<<(poVar4,psVar5);
      psVar5 = (string *)&this->sep;
    }
LAB_001246e3:
    std::operator<<(poVar4,psVar5);
  }
  else {
    pbVar1 = &this->sep;
    if (sVar2 != 0) {
      poVar4 = std::operator<<((ostream *)os,(string *)pbVar1);
      poVar4 = std::operator<<(poVar4,psVar5);
      poVar4 = std::operator<<(poVar4,*args);
      std::operator<<(poVar4,psVar5);
      poVar4 = std::operator<<((ostream *)os,(string *)pbVar1);
      poVar4 = std::operator<<(poVar4,psVar5);
      poVar4 = std::operator<<(poVar4,*args_1);
      goto LAB_001246e3;
    }
    poVar4 = std::operator<<((ostream *)os,(string *)pbVar1);
    std::operator<<(poVar4,*args);
    poVar4 = std::operator<<((ostream *)os,(string *)pbVar1);
    std::operator<<(poVar4,*args_1);
  }
  std::operator<<((ostream *)os,(string *)this);
  local_3c[0] = generic;
  bVar3 = is_escape<char[8]>(first,local_3c);
  if (!bVar3) {
    local_3c[2] = 1;
    bVar3 = is_escape<char[12]>(args,local_3c + 2);
    if (!bVar3) {
      local_3c[1] = 1;
      bVar3 = is_escape<char[15]>(args_1,local_3c + 1);
      if (!bVar3) goto LAB_0012474e;
    }
  }
  std::operator<<((ostream *)os,"\x1b[0m");
LAB_0012474e:
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }